

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsCell.cpp
# Opt level: O0

void __thiscall KDReports::Cell::build(Cell *this,ReportBuilder *builder)

{
  VariableType VVar1;
  Element *pEVar2;
  bool bVar3;
  pointer this_00;
  QColor local_50;
  ElementData *local_40;
  ElementData *ed;
  const_iterator local_30;
  const_iterator __end1;
  const_iterator __begin1;
  add_const_t<QList<KDReports::ElementData>_> *__range1;
  ReportBuilder *builder_local;
  Cell *this_local;
  
  this_00 = std::unique_ptr<KDReports::CellPrivate,_std::default_delete<KDReports::CellPrivate>_>::
            operator->(&this->d);
  __end1 = QList<KDReports::ElementData>::begin(&this_00->m_elements);
  local_30 = QList<KDReports::ElementData>::end(&this_00->m_elements);
  while( true ) {
    ed = local_30.i;
    bVar3 = QList<KDReports::ElementData>::const_iterator::operator!=(&__end1,local_30);
    if (!bVar3) break;
    local_40 = QList<KDReports::ElementData>::const_iterator::operator*(&__end1);
    switch(local_40->field_0x8 & 7) {
    case 0:
      (*builder->_vptr_ReportBuilder[8])(builder,local_40->m_element);
      break;
    case 1:
      pEVar2 = local_40->m_element;
      VVar1 = (local_40->field_2).m_variableType;
      QColor::QColor(&local_50);
      (*builder->_vptr_ReportBuilder[9])(builder,pEVar2,(ulong)VVar1,&local_50);
      break;
    case 2:
      (*builder->_vptr_ReportBuilder[10])(builder,(ulong)(local_40->field_2).m_variableType);
      break;
    case 3:
      (*builder->_vptr_ReportBuilder[0xb])((local_40->field_2).m_value);
    }
    QList<KDReports::ElementData>::const_iterator::operator++(&__end1);
  }
  return;
}

Assistant:

void KDReports::Cell::build(ReportBuilder &builder) const
{
    for (const KDReports::ElementData &ed : std::as_const(d->m_elements)) {
        switch (ed.m_type) {
        case KDReports::ElementData::Inline:
            builder.addInlineElement(*ed.m_element);
            break;
        case KDReports::ElementData::Block:
            builder.addBlockElement(*ed.m_element, ed.m_align);
            break;
        case KDReports::ElementData::Variable:
            builder.addVariable(ed.m_variableType);
            break;
        case KDReports::ElementData::VerticalSpacing:
            builder.addVerticalSpacing(ed.m_value);
            break;
        }
    }
}